

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O0

int ptls_hpke_setup_base_r
              (ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher,
              ptls_key_exchange_context_t *keyex,ptls_aead_context_t **ctx,ptls_iovec_t pk_s,
              ptls_iovec_t info)

{
  int local_7c;
  undefined1 local_78 [4];
  int ret;
  uint8_t secret [64];
  ptls_aead_context_t **ctx_local;
  ptls_key_exchange_context_t *keyex_local;
  ptls_hpke_cipher_suite_t *cipher_local;
  ptls_hpke_kem_t *kem_local;
  ptls_iovec_t pk_s_local;
  
  secret._56_8_ = ctx;
  local_7c = dh_decap(kem,local_78,keyex,pk_s,keyex->pubkey);
  if (local_7c == 0) {
    local_7c = key_schedule(kem,cipher,(ptls_aead_context_t **)secret._56_8_,0,local_78,info);
  }
  (*ptls_clear_memory)(local_78,0x40);
  return local_7c;
}

Assistant:

int ptls_hpke_setup_base_r(ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher, ptls_key_exchange_context_t *keyex,
                           ptls_aead_context_t **ctx, ptls_iovec_t pk_s, ptls_iovec_t info)
{
    uint8_t secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = dh_decap(kem, secret, keyex, pk_s, keyex->pubkey)) != 0)
        goto Exit;

    if ((ret = key_schedule(kem, cipher, ctx, 0, secret, info)) != 0)
        goto Exit;

Exit:
    ptls_clear_memory(secret, sizeof(secret));
    return ret;
}